

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

void __thiscall Fossilize::ZipDatabase::~ZipDatabase(ZipDatabase *this)

{
  bool bVar1;
  mz_bool mVar2;
  LogLevel LVar3;
  long lVar4;
  
  (this->super_DatabaseInterface)._vptr_DatabaseInterface = (_func_int **)&PTR__ZipDatabase_0016c9e8
  ;
  if (this->alive == true) {
    if (this->mode != ReadOnly) {
      mVar2 = mz_zip_writer_finalize_archive(&this->mz);
      if (mVar2 == 0) {
        LVar3 = get_thread_log_level();
        if ((int)LVar3 < 3) {
          bVar1 = Internal::log_thread_callback(LOG_ERROR,"Failed to finalize archive.\n");
          if (!bVar1) {
            fwrite("Fossilize ERROR: Failed to finalize archive.\n",0x2d,1,_stderr);
          }
        }
      }
    }
    mVar2 = mz_zip_end(&this->mz);
    if (mVar2 == 0) {
      LVar3 = get_thread_log_level();
      if ((int)LVar3 < 3) {
        bVar1 = Internal::log_thread_callback(LOG_ERROR,"mz_zip_end failed!\n");
        if (!bVar1) {
          fwrite("Fossilize ERROR: mz_zip_end failed!\n",0x24,1,_stderr);
        }
      }
    }
  }
  lVar4 = 0x298;
  do {
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)((long)&(this->super_DatabaseInterface)._vptr_DatabaseInterface + lVar4));
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != 0x68);
  std::__cxx11::string::_M_dispose();
  DatabaseInterface::~DatabaseInterface(&this->super_DatabaseInterface);
  return;
}

Assistant:

~ZipDatabase()
	{
		if (alive)
		{
			if (mode != DatabaseMode::ReadOnly)
			{
				if (!mz_zip_writer_finalize_archive(&mz))
					LOGE_LEVEL("Failed to finalize archive.\n");
			}

			if (!mz_zip_end(&mz))
				LOGE_LEVEL("mz_zip_end failed!\n");
		}
	}